

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ashared_ptr.h
# Opt level: O3

bool __thiscall
ashared_ptr<MapWrapper>::compare_exchange
          (ashared_ptr<MapWrapper> *this,ashared_ptr<MapWrapper> *expected,
          ashared_ptr<MapWrapper> *src)

{
  mutex *__mutex;
  __pointer_type pPVar1;
  int iVar2;
  PtrWrapper<MapWrapper> *target;
  bool bVar3;
  
  pPVar1 = (expected->object)._M_b._M_p;
  target = shareCurObject(src);
  __mutex = &this->lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  LOCK();
  bVar3 = pPVar1 == (this->object)._M_b._M_p;
  if (bVar3) {
    (this->object)._M_b._M_p = target;
  }
  UNLOCK();
  if (bVar3) {
    releaseObject(this,(expected->object)._M_b._M_p);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    operator=(expected,this);
    releaseObject(this,target);
  }
  return bVar3;
}

Assistant:

bool compare_exchange(ashared_ptr<T>& expected, ashared_ptr<T> src) {
        // Note: it is OK that `expected` becomes outdated.
        PtrWrapper<T>* expected_ptr = expected.object.load(MO);
        PtrWrapper<T>* val_ptr = src.shareCurObject();

        { // Lock for `object`
            std::lock_guard<std::mutex> l(lock);
            if (object.compare_exchange_weak(expected_ptr, val_ptr)) {
                // Succeeded.
                // Release old object.
                releaseObject(expected.object.load(MO));
                return true;
            }
        }
        // Failed.
        expected = *this;
        // Release the object from `src`.
        releaseObject(val_ptr);
        return false;
    }